

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsBinarySemaphore.h
# Opt level: O0

bool __thiscall HighsBinarySemaphore::try_acquire(HighsBinarySemaphore *this)

{
  pointer pDVar1;
  bool bVar2;
  int expected;
  
  pDVar1 = std::
           unique_ptr<HighsBinarySemaphore::Data,_highs::cache_aligned::Deleter<HighsBinarySemaphore::Data>_>
           ::operator->((unique_ptr<HighsBinarySemaphore::Data,_highs::cache_aligned::Deleter<HighsBinarySemaphore::Data>_>
                         *)0x4bc827);
  LOCK();
  bVar2 = (pDVar1->count).super___atomic_base<int>._M_i == 1;
  if (bVar2) {
    (pDVar1->count).super___atomic_base<int>._M_i = 0;
  }
  UNLOCK();
  return bVar2;
}

Assistant:

bool try_acquire() {
    int expected = 1;
    return data_->count.compare_exchange_weak(
        expected, 0, std::memory_order_acquire, std::memory_order_relaxed);
  }